

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoConvert<long,float>(Thread *this,Ptr *out_trap)

{
  float fVar1;
  Value VVar2;
  
  VVar2 = Pop(this);
  fVar1 = (float)VVar2.field_0.f32_;
  if (NAN(fVar1)) {
    DoConvert<long,float>();
  }
  else {
    if ((-9.223372e+18 <= fVar1) && (fVar1 < 9.223372e+18)) {
      VVar2.field_0._0_8_ = (ulong)fVar1;
      VVar2.field_0._8_8_ = 0;
      Push(this,VVar2);
      return Ok;
    }
    DoConvert<long,float>();
  }
  return Trap;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}